

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O0

int cache_get(uint64_t a,uint64_t b,uint64_t c,uint64_t *res)

{
  uint *puVar1;
  uint uVar2;
  uint64_t uVar3;
  cache_entry_t pcVar4;
  uint32_t s;
  cache_entry_t bucket;
  uint32_t *s_bucket;
  uint64_t hash;
  uint64_t *res_local;
  uint64_t c_local;
  uint64_t b_local;
  uint64_t a_local;
  
  uVar3 = cache_hash(a,b,c);
  puVar1 = cache_status + (uVar3 & cache_mask);
  pcVar4 = cache_table + (uVar3 & cache_mask);
  uVar2 = *puVar1;
  if ((uVar2 & 0xc0000000) == 0) {
    if ((((ulong)uVar2 ^ uVar3 >> 0x20) & 0x3fff0000) == 0) {
      if (((pcVar4->a == a) && (pcVar4->b == b)) && (pcVar4->c == c)) {
        *res = pcVar4->res;
        a_local._4_4_ = (uint)(*puVar1 == uVar2);
      }
      else {
        a_local._4_4_ = 0;
      }
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int
cache_get(uint64_t a, uint64_t b, uint64_t c, uint64_t *res)
{
    const uint64_t hash = cache_hash(a, b, c);
#if CACHE_MASK
    _Atomic(uint32_t) *s_bucket = (_Atomic(uint32_t)*)cache_status + (hash & cache_mask);
    cache_entry_t bucket = cache_table + (hash & cache_mask);
#else
    _Atomic(uint32_t) *s_bucket = (_Atomic(uint32_t)*)cache_status + (hash % cache_size);
    cache_entry_t bucket = cache_table + (hash % cache_size);
#endif
    const uint32_t s = atomic_load_explicit(s_bucket, memory_order_relaxed);
    // abort if locked or if part of a 2-part cache entry
    if (s & 0xc0000000) return 0;
    // abort if different hash
    if ((s ^ (hash>>32)) & 0x3fff0000) return 0;
    // abort if key different
    if (bucket->a != a || bucket->b != b || bucket->c != c) return 0;
    *res = bucket->res;
    // abort if status field changed after compiler_barrier()
    return atomic_load_explicit(s_bucket, memory_order_acquire) == s ? 1 : 0;
}